

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O0

bool __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::tag_is_comma
          (quasiquote_conversion_visitor *this,cell *c)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  bool local_22;
  bool local_21;
  cell *c_local;
  quasiquote_conversion_visitor *this_local;
  
  if ((c->type == ct_pair) &&
     (sVar2 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::size(&c->pair), sVar2 == 2)) {
    pvVar3 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[](&c->pair,0);
    local_21 = false;
    if (pvVar3->type == ct_symbol) {
      pvVar3 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[](&c->pair,0);
      bVar1 = std::operator==(&pvVar3->value,",");
      local_22 = true;
      if (!bVar1) {
        pvVar3 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[](&c->pair,0);
        local_22 = std::operator==(&pvVar3->value,"unquote");
      }
      local_21 = local_22;
    }
    return local_21;
  }
  return false;
}

Assistant:

bool tag_is_comma(const cell& c)
      {
      if (c.type == ct_pair && c.pair.size() == 2)
        {
        return (c.pair[0].type == ct_symbol && ((c.pair[0].value == ",") || (c.pair[0].value == "unquote")));
        }
      return false;
      }